

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::quantize_to_int8(Mat *src,Mat *dst,Mat *scale_data,Option *opt)

{
  int *piVar1;
  Layer *pLVar2;
  void **ppvVar3;
  undefined8 in_RCX;
  void **in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  Mat weights [1];
  ParamDict pd;
  Layer *quantize;
  ParamDict *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe3c;
  Mat *in_stack_fffffffffffffe48;
  ParamDict *in_stack_fffffffffffffe50;
  void **ppvVar4;
  void **local_198;
  void **local_158;
  undefined1 local_148 [16];
  void *local_138;
  int *local_130;
  void *local_128;
  undefined4 local_120;
  long *local_118;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_100;
  void *local_f8;
  void *apvStack_f0 [3];
  ParamDict local_d8;
  Layer *local_c8;
  undefined8 local_c0;
  void **local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  void **local_a0;
  void **local_90;
  int local_80;
  undefined4 local_7c;
  void **local_78;
  void **local_70;
  void **local_68;
  int local_60;
  undefined4 local_5c;
  void **local_58;
  int local_40;
  undefined4 local_3c;
  void **local_38;
  void *local_18;
  
  local_c0 = in_RCX;
  local_b8 = in_RDX;
  local_b0 = in_RSI;
  local_a8 = in_RDI;
  local_c8 = create_layer(in_stack_fffffffffffffe3c);
  ParamDict::ParamDict(in_stack_fffffffffffffe50);
  ParamDict::set(&local_d8,0,*(int *)((long)local_b8 + 0x2c));
  (*local_c8->_vptr_Layer[2])(local_c8,&local_d8);
  local_158 = &local_138;
  do {
    local_a0 = local_158;
    *local_158 = (void *)0x0;
    local_158[1] = (void *)0x0;
    local_158[2] = (void *)0x0;
    *(undefined4 *)(local_158 + 3) = 0;
    local_158[4] = (void *)0x0;
    *(undefined4 *)(local_158 + 5) = 0;
    *(undefined4 *)((long)local_158 + 0x2c) = 0;
    *(undefined4 *)(local_158 + 6) = 0;
    *(undefined4 *)((long)local_158 + 0x34) = 0;
    *(undefined4 *)(local_158 + 7) = 0;
    local_158[8] = (void *)0x0;
    local_158 = local_158 + 9;
  } while (local_158 != apvStack_f0);
  local_78 = local_b8;
  local_70 = &local_138;
  if (&local_138 != local_b8) {
    if (local_b8[1] != (void *)0x0) {
      piVar1 = (int *)local_b8[1];
      local_7c = 1;
      LOCK();
      local_80 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_58 = &local_138;
    if (local_130 != (int *)0x0) {
      local_5c = 0xffffffff;
      LOCK();
      local_60 = *local_130;
      *local_130 = *local_130 + -1;
      UNLOCK();
      if (local_60 == 1) {
        if (local_118 == (long *)0x0) {
          if (local_138 != (void *)0x0) {
            free(local_138);
          }
        }
        else {
          (**(code **)(*local_118 + 0x18))(local_118,local_138);
        }
      }
    }
    local_138 = *local_78;
    local_130 = (int *)local_78[1];
    local_128 = local_78[2];
    local_120 = *(undefined4 *)(local_78 + 3);
    local_118 = (long *)local_78[4];
    local_110 = *(undefined4 *)(local_78 + 5);
    local_10c = *(undefined4 *)((long)local_78 + 0x2c);
    local_108 = *(undefined4 *)(local_78 + 6);
    local_104 = *(undefined4 *)((long)local_78 + 0x34);
    local_100 = *(undefined4 *)(local_78 + 7);
    local_f8 = local_78[8];
  }
  pLVar2 = local_c8;
  local_68 = &local_138;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  (*pLVar2->_vptr_Layer[3])(pLVar2,local_148);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffe30);
  (*local_c8->_vptr_Layer[4])(local_c8,local_c0);
  (*local_c8->_vptr_Layer[7])(local_c8,local_a8,local_b0,local_c0);
  (*local_c8->_vptr_Layer[5])(local_c8,local_c0);
  if (local_c8 != (Layer *)0x0) {
    (*local_c8->_vptr_Layer[1])();
  }
  local_198 = apvStack_f0;
  do {
    ppvVar3 = local_198 + -9;
    ppvVar4 = ppvVar3;
    local_90 = ppvVar3;
    local_38 = ppvVar3;
    if (local_198[-8] != (void *)0x0) {
      piVar1 = (int *)local_198[-8];
      local_3c = 0xffffffff;
      LOCK();
      local_40 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_40 == 1) {
        if (local_198[-5] == (void *)0x0) {
          local_18 = *ppvVar3;
          if (local_18 != (void *)0x0) {
            free(local_18);
          }
        }
        else {
          (**(code **)(*local_198[-5] + 0x18))(local_198[-5],*ppvVar3);
        }
      }
    }
    *ppvVar3 = (void *)0x0;
    local_198[-7] = (void *)0x0;
    *(undefined4 *)(local_198 + -6) = 0;
    *(undefined4 *)(local_198 + -4) = 0;
    *(undefined4 *)((long)local_198 + -0x1c) = 0;
    *(undefined4 *)(local_198 + -3) = 0;
    *(undefined4 *)((long)local_198 + -0x14) = 0;
    *(undefined4 *)(local_198 + -2) = 0;
    local_198[-1] = (void *)0x0;
    local_198[-8] = (void *)0x0;
    local_198 = ppvVar4;
  } while (ppvVar4 != &local_138);
  ParamDict::~ParamDict(in_stack_fffffffffffffe30);
  return;
}

Assistant:

void quantize_to_int8(const Mat& src, Mat& dst, const Mat& scale_data, const Option& opt)
{
    Layer* quantize = create_layer(LayerType::Quantize);

    ParamDict pd;
    pd.set(0, scale_data.w);

    quantize->load_param(pd);

    Mat weights[1];
    weights[0] = scale_data;

    quantize->load_model(ModelBinFromMatArray(weights));

    quantize->create_pipeline(opt);

    quantize->forward(src, dst, opt);

    quantize->destroy_pipeline(opt);

    delete quantize;
}